

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O2

bool Jinx::Impl::StringToNumber(String *value,double *outValue,NumericFormat format)

{
  byte bVar1;
  allocator<char> local_1e1;
  locale local_1e0 [8];
  locale local_1d8 [8];
  String s;
  string local_1b0 [32];
  istringstream istr;
  undefined7 uStack_18f;
  byte abStack_170 [352];
  
  if (outValue != (double *)0x0) {
    if (format == Continental) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::basic_string
                (&s,value);
      istr = (istringstream)0x2c;
      local_1b0[0] = (string)0x2e;
      std::
      replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>>,char>
                ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
                  )s._M_dataplus._M_p,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>
                  )(s._M_dataplus._M_p + s._M_string_length),(char *)&istr,(char *)local_1b0);
      std::__cxx11::string::string<std::allocator<char>>(local_1b0,s._M_dataplus._M_p,&local_1e1);
      std::__cxx11::istringstream::istringstream((istringstream *)&istr,local_1b0,_S_in);
      std::__cxx11::string::~string(local_1b0);
      std::locale::classic();
      std::ios::imbue(local_1d8);
      std::locale::~locale(local_1d8);
      std::istream::_M_extract<double>((double *)&istr);
      bVar1 = abStack_170[*(long *)(CONCAT71(uStack_18f,istr) + -0x18)];
      std::__cxx11::istringstream::~istringstream((istringstream *)&istr);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
      ~basic_string(&s);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&s,(value->_M_dataplus)._M_p,(allocator<char> *)local_1b0);
      std::__cxx11::istringstream::istringstream((istringstream *)&istr,(string *)&s,_S_in);
      std::__cxx11::string::~string((string *)&s);
      std::locale::classic();
      std::ios::imbue(local_1e0);
      std::locale::~locale(local_1e0);
      std::istream::_M_extract<double>((double *)&istr);
      bVar1 = abStack_170[*(long *)(CONCAT71(uStack_18f,istr) + -0x18)];
      std::__cxx11::istringstream::~istringstream((istringstream *)&istr);
    }
    return (bVar1 & 5) == 0;
  }
  __assert_fail("outValue",
                "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Tests/UnitTests/../../Include/Jinx.hpp"
                ,0xd3c,"bool Jinx::Impl::StringToNumber(const String &, double *, NumericFormat)");
}

Assistant:

inline bool StringToNumber(const String & value, double * outValue, NumericFormat format)
	{
		assert(outValue);
#ifdef JINX_USE_FROM_CHARS
		// In case contintental format is used, replace commas with decimal point
		if (format == NumericFormat::Continental)
		{
			String s = value;
			std::replace(s.begin(), s.end(), ',', '.');
			auto result = std::from_chars(s.data(), s.data() + s.size(), *outValue);
			if (result.ptr == s.data() + s.size())
				return true;
		}
		else
		{
			auto result = std::from_chars(value.data(), value.data() + value.size(), *outValue);
			if (result.ptr == value.data() + value.size())
				return true;
		}
		return false;
#else
		// In case contintental format is used, replace commas with decimal point
		if (format == NumericFormat::Continental)
		{
			String s = value;
			std::replace(s.begin(), s.end(), ',', '.');
			std::istringstream istr(s.c_str());
			istr.imbue(std::locale::classic());
			istr >> *outValue;
			if (istr.fail())
				return false;
		}
		else
		{
			std::istringstream istr(value.c_str());
			istr.imbue(std::locale::classic());
			istr >> *outValue;
			if (istr.fail())
				return false;
		}
		return true;
#endif
	}